

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptor_pecompute_haar(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  float *in_RSI;
  integral_image *in_RDI;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_x;
  int k_2;
  int gauss_index_k;
  float gauss_s1_y;
  int l_2;
  int gauss_index_l_inc;
  int gauss_index_l;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float *j_arr;
  int j;
  int gauss_index_k_inc;
  int gauss_index_k_start;
  float *i_arr;
  int i;
  float e_c1_p4;
  float e_c1_p3;
  float e_c1_p2;
  float e_c1_p1;
  float e_c1_m1;
  float e_c1_m2;
  float e_c1_m3;
  float e_c1_m4;
  float e_c0_p4;
  float e_c0_p3;
  float e_c0_p2;
  float e_c0_p1;
  float e_c0_m1;
  float e_c0_m2;
  float e_c0_m3;
  float e_c0_m4;
  float s11;
  float s10;
  float s9;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  int sample_x_sub_int_scale_1;
  int k_count_1;
  int k_1;
  int sample_y_sub_int_scale_1;
  int l_count_1;
  int l_1;
  int sample_x_sub_int_scale;
  int k_count;
  int k;
  int sample_y_sub_int_scale;
  int l_count;
  int l;
  int gauss_s2_index;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  int height;
  int width;
  float ipoint_y_sub_int_scale;
  float ipoint_x_sub_int_scale;
  float ipoint_y;
  float ipoint_x;
  float g1_factor;
  float scale_squared;
  int int_scale;
  float scale;
  int local_16c;
  int local_138;
  int local_134;
  int local_12c;
  int local_124;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  float fVar89;
  undefined8 in_stack_fffffffffffffef0;
  float *pfVar90;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int iVar91;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  float *local_f8;
  int local_f0;
  int local_78;
  int local_74;
  int local_6c;
  int local_68;
  int local_5c;
  int local_50;
  int local_4c;
  float local_48;
  int local_44;
  
  fVar89 = in_RSI[2];
  auVar23._8_4_ = 0x80000000;
  auVar23._0_8_ = 0x8000000080000000;
  auVar23._12_4_ = 0x80000000;
  auVar17._8_4_ = 0x3effffff;
  auVar17._0_8_ = 0x3effffff3effffff;
  auVar17._12_4_ = 0x3effffff;
  auVar15 = vpternlogd_avx512vl(auVar17,ZEXT416((uint)fVar89),auVar23,0xf8);
  auVar15 = vroundss_avx(ZEXT416((uint)fVar89),ZEXT416((uint)(fVar89 + auVar15._0_4_)),0xb);
  iVar12 = (int)auVar15._0_4_;
  fVar25 = -0.08 / (fVar89 * fVar89);
  fVar27 = *in_RSI;
  auVar24._8_4_ = 0x80000000;
  auVar24._0_8_ = 0x8000000080000000;
  auVar24._12_4_ = 0x80000000;
  auVar18._8_4_ = 0x3effffff;
  auVar18._0_8_ = 0x3effffff3effffff;
  auVar18._12_4_ = 0x3effffff;
  auVar15 = vpternlogd_avx512vl(auVar18,ZEXT416((uint)fVar27),auVar24,0xf8);
  auVar15 = vroundss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)(fVar27 + auVar15._0_4_)),0xb);
  auVar21._0_8_ = (double)auVar15._0_4_;
  auVar21._8_8_ = 0;
  auVar15._0_8_ = (double)fVar89;
  auVar15._8_8_ = 0;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar15,auVar21);
  fVar26 = (float)auVar15._0_8_;
  fVar27 = in_RSI[1];
  auVar68._8_4_ = 0x80000000;
  auVar68._0_8_ = 0x8000000080000000;
  auVar68._12_4_ = 0x80000000;
  auVar19._8_4_ = 0x3effffff;
  auVar19._0_8_ = 0x3effffff3effffff;
  auVar19._12_4_ = 0x3effffff;
  auVar15 = vpternlogd_avx512vl(auVar19,ZEXT416((uint)fVar27),auVar68,0xf8);
  auVar15 = vroundss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)(fVar27 + auVar15._0_4_)),0xb);
  auVar22._0_8_ = (double)auVar15._0_4_;
  auVar22._8_8_ = 0;
  auVar16._0_8_ = (double)fVar89;
  auVar16._8_8_ = 0;
  auVar15 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar16,auVar22);
  fVar27 = (float)auVar15._0_8_;
  local_44 = 0;
  local_48 = 0.0;
  local_4c = 0;
  auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar89),
                            ZEXT416((uint)fVar26));
  auVar69._8_4_ = 0x80000000;
  auVar69._0_8_ = 0x8000000080000000;
  auVar69._12_4_ = 0x80000000;
  auVar20._8_4_ = 0x3effffff;
  auVar20._0_8_ = 0x3effffff3effffff;
  auVar20._12_4_ = 0x3effffff;
  auVar16 = vpternlogd_avx512vl(auVar20,auVar15,auVar69,0xf8);
  auVar15 = vroundss_avx(auVar15,ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_)),0xb);
  auVar42 = ZEXT1664(auVar15);
  if (0 < (int)auVar15._0_4_ - iVar12) {
    auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar89),
                              ZEXT416((uint)fVar27));
    auVar70._8_4_ = 0x80000000;
    auVar70._0_8_ = 0x8000000080000000;
    auVar70._12_4_ = 0x80000000;
    auVar43._8_4_ = 0x3effffff;
    auVar43._0_8_ = 0x3effffff3effffff;
    auVar43._12_4_ = 0x3effffff;
    auVar16 = vpternlogd_avx512vl(auVar43,auVar15,auVar70,0xf8);
    auVar15 = vroundss_avx(auVar15,ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_)),0xb);
    auVar42 = ZEXT1664(auVar15);
    if (0 < (int)auVar15._0_4_ - iVar12) {
      auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar89),
                                ZEXT416((uint)fVar26));
      auVar71._8_4_ = 0x80000000;
      auVar71._0_8_ = 0x8000000080000000;
      auVar71._12_4_ = 0x80000000;
      auVar44._8_4_ = 0x3effffff;
      auVar44._0_8_ = 0x3effffff3effffff;
      auVar44._12_4_ = 0x3effffff;
      auVar16 = vpternlogd_avx512vl(auVar44,auVar15,auVar71,0xf8);
      auVar15 = vroundss_avx(auVar15,ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_)),0xb);
      auVar42 = ZEXT1664(auVar15);
      if ((int)auVar15._0_4_ + iVar12 <= in_RDI->width) {
        auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar89),
                                  ZEXT416((uint)fVar27));
        auVar72._8_4_ = 0x80000000;
        auVar72._0_8_ = 0x8000000080000000;
        auVar72._12_4_ = 0x80000000;
        auVar45._8_4_ = 0x3effffff;
        auVar45._0_8_ = 0x3effffff3effffff;
        auVar45._12_4_ = 0x3effffff;
        auVar16 = vpternlogd_avx512vl(auVar45,auVar15,auVar72,0xf8);
        auVar15 = vroundss_avx(auVar15,ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_)),0xb);
        auVar42 = ZEXT1664(auVar15);
        if ((int)auVar15._0_4_ + iVar12 <= in_RDI->height) {
          local_6c = 0;
          for (local_68 = -0xc; local_68 < 0xc; local_68 = local_68 + 1) {
            auVar50._0_4_ = (float)local_68;
            auVar50._4_12_ = auVar42._4_12_;
            auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar89),auVar50,
                                      ZEXT416((uint)(fVar27 - (float)iVar12)));
            auVar75._8_4_ = 0x80000000;
            auVar75._0_8_ = 0x8000000080000000;
            auVar75._12_4_ = 0x80000000;
            auVar51._8_4_ = 0x3effffff;
            auVar51._0_8_ = 0x3effffff3effffff;
            auVar51._12_4_ = 0x3effffff;
            auVar16 = vpternlogd_avx512vl(auVar51,auVar15,auVar75,0xf8);
            auVar15 = vroundss_avx(auVar15,ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_)),0xb);
            auVar42 = ZEXT1664(auVar15);
            local_78 = 0;
            for (local_74 = -0xc; local_74 < 0xc; local_74 = local_74 + 1) {
              auVar52._0_4_ = (float)local_74;
              auVar52._4_12_ = auVar42._4_12_;
              auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar89),auVar52,
                                        ZEXT416((uint)(fVar26 - (float)iVar12)));
              auVar76._8_4_ = 0x80000000;
              auVar76._0_8_ = 0x8000000080000000;
              auVar76._12_4_ = 0x80000000;
              auVar53._8_4_ = 0x3effffff;
              auVar53._0_8_ = 0x3effffff3effffff;
              auVar53._12_4_ = 0x3effffff;
              auVar17 = vpternlogd_avx512vl(auVar53,auVar16,auVar76,0xf8);
              auVar16 = vroundss_avx(auVar16,ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_)),0xb);
              auVar42 = ZEXT1664(auVar16);
              haarXY_unconditional
                        (in_RDI,(int)auVar15._0_4_,(int)auVar16._0_4_,iVar12,
                         haarResponseX + (local_6c * 0x18 + local_78),
                         haarResponseY + (local_6c * 0x18 + local_78));
              local_78 = local_78 + 1;
            }
            local_6c = local_6c + 1;
          }
          goto LAB_0018618d;
        }
      }
    }
  }
  for (local_50 = -0xc; local_50 < 0xc; local_50 = local_50 + 1) {
    auVar46._0_4_ = (float)local_50;
    auVar46._4_12_ = auVar42._4_12_;
    auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar89),auVar46,ZEXT416((uint)(fVar27 - (float)iVar12)))
    ;
    auVar73._8_4_ = 0x80000000;
    auVar73._0_8_ = 0x8000000080000000;
    auVar73._12_4_ = 0x80000000;
    auVar47._8_4_ = 0x3effffff;
    auVar47._0_8_ = 0x3effffff3effffff;
    auVar47._12_4_ = 0x3effffff;
    auVar16 = vpternlogd_avx512vl(auVar47,auVar15,auVar73,0xf8);
    auVar15 = vroundss_avx(auVar15,ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_)),0xb);
    auVar42 = ZEXT1664(auVar15);
    for (local_5c = -0xc; local_5c < 0xc; local_5c = local_5c + 1) {
      auVar48._0_4_ = (float)local_5c;
      auVar48._4_12_ = auVar42._4_12_;
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar89),auVar48,
                                ZEXT416((uint)(fVar26 - (float)iVar12)));
      auVar74._8_4_ = 0x80000000;
      auVar74._0_8_ = 0x8000000080000000;
      auVar74._12_4_ = 0x80000000;
      auVar49._8_4_ = 0x3effffff;
      auVar49._0_8_ = 0x3effffff3effffff;
      auVar49._12_4_ = 0x3effffff;
      auVar16 = vpternlogd_avx512vl(auVar49,auVar15,auVar74,0xf8);
      auVar15 = vroundss_avx(auVar15,ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_)),0xb);
      auVar42 = ZEXT1664(auVar15);
      haarXY_precheck_boundaries
                ((integral_image *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                 (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                 (float *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (float *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    }
  }
LAB_0018618d:
  auVar30._4_12_ = SUB1612(ZEXT816(0x3fe0000000000000),4);
  auVar30._0_4_ = fVar89 * 0.5;
  auVar77._8_4_ = 0x80000000;
  auVar77._0_8_ = 0x8000000080000000;
  auVar77._12_4_ = 0x80000000;
  auVar54._8_4_ = 0x3effffff;
  auVar54._0_8_ = 0x3effffff3effffff;
  auVar54._12_4_ = 0x3effffff;
  auVar15 = vpternlogd_avx512vl(auVar54,auVar30,auVar77,0xf8);
  auVar15 = vroundss_avx(auVar30,ZEXT416((uint)(fVar89 * 0.5 + auVar15._0_4_)),0xb);
  auVar31._4_12_ = SUB1612(ZEXT816(0x3ff8000000000000),4);
  auVar31._0_4_ = fVar89 * 1.5;
  auVar78._8_4_ = 0x80000000;
  auVar78._0_8_ = 0x8000000080000000;
  auVar78._12_4_ = 0x80000000;
  auVar55._8_4_ = 0x3effffff;
  auVar55._0_8_ = 0x3effffff3effffff;
  auVar55._12_4_ = 0x3effffff;
  auVar16 = vpternlogd_avx512vl(auVar55,auVar31,auVar78,0xf8);
  auVar16 = vroundss_avx(auVar31,ZEXT416((uint)(fVar89 * 1.5 + auVar16._0_4_)),0xb);
  auVar32._4_12_ = SUB1612(ZEXT816(0x4004000000000000),4);
  auVar32._0_4_ = fVar89 * 2.5;
  auVar79._8_4_ = 0x80000000;
  auVar79._0_8_ = 0x8000000080000000;
  auVar79._12_4_ = 0x80000000;
  auVar56._8_4_ = 0x3effffff;
  auVar56._0_8_ = 0x3effffff3effffff;
  auVar56._12_4_ = 0x3effffff;
  auVar17 = vpternlogd_avx512vl(auVar56,auVar32,auVar79,0xf8);
  auVar17 = vroundss_avx(auVar32,ZEXT416((uint)(fVar89 * 2.5 + auVar17._0_4_)),0xb);
  fVar28 = auVar17._0_4_;
  auVar33._4_12_ = SUB1612(ZEXT816(0x400c000000000000),4);
  auVar33._0_4_ = fVar89 * 3.5;
  auVar80._8_4_ = 0x80000000;
  auVar80._0_8_ = 0x8000000080000000;
  auVar80._12_4_ = 0x80000000;
  auVar57._8_4_ = 0x3effffff;
  auVar57._0_8_ = 0x3effffff3effffff;
  auVar57._12_4_ = 0x3effffff;
  auVar17 = vpternlogd_avx512vl(auVar57,auVar33,auVar80,0xf8);
  auVar17 = vroundss_avx(auVar33,ZEXT416((uint)(fVar89 * 3.5 + auVar17._0_4_)),0xb);
  auVar34._4_12_ = SUB1612(ZEXT816(0x4012000000000000),4);
  auVar34._0_4_ = fVar89 * 4.5;
  auVar81._8_4_ = 0x80000000;
  auVar81._0_8_ = 0x8000000080000000;
  auVar81._12_4_ = 0x80000000;
  auVar58._8_4_ = 0x3effffff;
  auVar58._0_8_ = 0x3effffff3effffff;
  auVar58._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar58,auVar34,auVar81,0xf8);
  auVar18 = vroundss_avx(auVar34,ZEXT416((uint)(fVar89 * 4.5 + auVar18._0_4_)),0xb);
  auVar35._4_12_ = SUB1612(ZEXT816(0x4016000000000000),4);
  auVar35._0_4_ = fVar89 * 5.5;
  auVar82._8_4_ = 0x80000000;
  auVar82._0_8_ = 0x8000000080000000;
  auVar82._12_4_ = 0x80000000;
  auVar59._8_4_ = 0x3effffff;
  auVar59._0_8_ = 0x3effffff3effffff;
  auVar59._12_4_ = 0x3effffff;
  auVar19 = vpternlogd_avx512vl(auVar59,auVar35,auVar82,0xf8);
  auVar19 = vroundss_avx(auVar35,ZEXT416((uint)(fVar89 * 5.5 + auVar19._0_4_)),0xb);
  auVar36._4_12_ = SUB1612(ZEXT816(0x401a000000000000),4);
  auVar36._0_4_ = fVar89 * 6.5;
  auVar83._8_4_ = 0x80000000;
  auVar83._0_8_ = 0x8000000080000000;
  auVar83._12_4_ = 0x80000000;
  auVar60._8_4_ = 0x3effffff;
  auVar60._0_8_ = 0x3effffff3effffff;
  auVar60._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar60,auVar36,auVar83,0xf8);
  auVar20 = vroundss_avx(auVar36,ZEXT416((uint)(fVar89 * 6.5 + auVar20._0_4_)),0xb);
  auVar37._4_12_ = SUB1612(ZEXT816(0x401e000000000000),4);
  auVar37._0_4_ = fVar89 * 7.5;
  auVar84._8_4_ = 0x80000000;
  auVar84._0_8_ = 0x8000000080000000;
  auVar84._12_4_ = 0x80000000;
  auVar61._8_4_ = 0x3effffff;
  auVar61._0_8_ = 0x3effffff3effffff;
  auVar61._12_4_ = 0x3effffff;
  auVar21 = vpternlogd_avx512vl(auVar61,auVar37,auVar84,0xf8);
  auVar21 = vroundss_avx(auVar37,ZEXT416((uint)(fVar89 * 7.5 + auVar21._0_4_)),0xb);
  fVar29 = auVar21._0_4_;
  auVar38._4_12_ = SUB1612(ZEXT816(0x4021000000000000),4);
  auVar38._0_4_ = fVar89 * 8.5;
  auVar85._8_4_ = 0x80000000;
  auVar85._0_8_ = 0x8000000080000000;
  auVar85._12_4_ = 0x80000000;
  auVar62._8_4_ = 0x3effffff;
  auVar62._0_8_ = 0x3effffff3effffff;
  auVar62._12_4_ = 0x3effffff;
  auVar21 = vpternlogd_avx512vl(auVar62,auVar38,auVar85,0xf8);
  auVar21 = vroundss_avx(auVar38,ZEXT416((uint)(fVar89 * 8.5 + auVar21._0_4_)),0xb);
  auVar39._4_12_ = SUB1612(ZEXT816(0x4023000000000000),4);
  auVar39._0_4_ = fVar89 * 9.5;
  auVar86._8_4_ = 0x80000000;
  auVar86._0_8_ = 0x8000000080000000;
  auVar86._12_4_ = 0x80000000;
  auVar63._8_4_ = 0x3effffff;
  auVar63._0_8_ = 0x3effffff3effffff;
  auVar63._12_4_ = 0x3effffff;
  auVar22 = vpternlogd_avx512vl(auVar63,auVar39,auVar86,0xf8);
  auVar22 = vroundss_avx(auVar39,ZEXT416((uint)(fVar89 * 9.5 + auVar22._0_4_)),0xb);
  auVar40._4_12_ = SUB1612(ZEXT816(0x4025000000000000),4);
  auVar40._0_4_ = fVar89 * 10.5;
  auVar87._8_4_ = 0x80000000;
  auVar87._0_8_ = 0x8000000080000000;
  auVar87._12_4_ = 0x80000000;
  auVar64._8_4_ = 0x3effffff;
  auVar64._0_8_ = 0x3effffff3effffff;
  auVar64._12_4_ = 0x3effffff;
  auVar23 = vpternlogd_avx512vl(auVar64,auVar40,auVar87,0xf8);
  auVar23 = vroundss_avx(auVar40,ZEXT416((uint)(fVar89 * 10.5 + auVar23._0_4_)),0xb);
  auVar41._4_12_ = SUB1612(ZEXT816(0x4027000000000000),4);
  auVar41._0_4_ = fVar89 * 11.5;
  auVar88._8_4_ = 0x80000000;
  auVar88._0_8_ = 0x8000000080000000;
  auVar88._12_4_ = 0x80000000;
  auVar65._8_4_ = 0x3effffff;
  auVar65._0_8_ = 0x3effffff3effffff;
  auVar65._12_4_ = 0x3effffff;
  auVar24 = vpternlogd_avx512vl(auVar65,auVar41,auVar88,0xf8);
  auVar24 = vroundss_avx(auVar41,ZEXT416((uint)(fVar89 * 11.5 + auVar24._0_4_)),0xb);
  fVar89 = fVar28 + auVar16._0_4_;
  fVar27 = fVar28 + auVar15._0_4_;
  fVar26 = fVar28 - auVar15._0_4_;
  fVar1 = fVar28 - auVar16._0_4_;
  fVar2 = fVar28 - auVar17._0_4_;
  fVar3 = fVar28 - auVar18._0_4_;
  fVar4 = fVar28 - auVar19._0_4_;
  fVar28 = fVar28 - auVar20._0_4_;
  fVar5 = fVar29 - auVar17._0_4_;
  fVar6 = fVar29 - auVar18._0_4_;
  fVar7 = fVar29 - auVar19._0_4_;
  fVar8 = fVar29 - auVar20._0_4_;
  fVar9 = fVar29 - auVar21._0_4_;
  fVar10 = fVar29 - auVar22._0_4_;
  fVar11 = fVar29 - auVar23._0_4_;
  fVar29 = fVar29 - auVar24._0_4_;
  gauss_s1_c0[0] = expf(fVar25 * fVar89 * fVar89);
  gauss_s1_c0[1] = expf(fVar25 * fVar27 * fVar27);
  gauss_s1_c0[2] = expf(fVar25 * fVar26 * fVar26);
  gauss_s1_c0[3] = expf(fVar25 * fVar1 * fVar1);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar25 * fVar2 * fVar2);
  gauss_s1_c0[6] = expf(fVar25 * fVar3 * fVar3);
  gauss_s1_c0[7] = expf(fVar25 * fVar4 * fVar4);
  gauss_s1_c0[8] = expf(fVar25 * fVar28 * fVar28);
  gauss_s1_c1[0] = expf(fVar25 * fVar5 * fVar5);
  gauss_s1_c1[1] = expf(fVar25 * fVar6 * fVar6);
  gauss_s1_c1[2] = expf(fVar25 * fVar7 * fVar7);
  gauss_s1_c1[3] = expf(fVar25 * fVar8 * fVar8);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar25 * fVar9 * fVar9);
  gauss_s1_c1[6] = expf(fVar25 * fVar10 * fVar10);
  gauss_s1_c1[7] = expf(fVar25 * fVar11 * fVar11);
  gauss_s1_c1[8] = expf(fVar25 * fVar29 * fVar29);
  for (local_f0 = -8; local_f0 < 8; local_f0 = local_f0 + 5) {
    if ((local_f0 == -8) || (local_f0 == 7)) {
      local_f8 = gauss_s1_c1;
    }
    else {
      local_f8 = gauss_s1_c0;
    }
    iVar12 = 0;
    if (local_f0 < 0) {
      iVar12 = 8;
    }
    iVar13 = 1;
    if (local_f0 < 0) {
      iVar13 = -1;
    }
    for (iVar91 = -8; iVar91 < 8; iVar91 = iVar91 + 5) {
      if ((iVar91 == -8) || (iVar91 == 7)) {
        pfVar90 = gauss_s1_c1;
      }
      else {
        pfVar90 = gauss_s1_c0;
      }
      fVar89 = 0.0;
      fVar27 = 0.0;
      fVar25 = 0.0;
      fVar26 = 0.0;
      local_124 = 0;
      if (iVar91 < 0) {
        local_124 = 8;
      }
      iVar14 = 1;
      if (iVar91 < 0) {
        iVar14 = -1;
      }
      for (local_12c = (iVar91 + 8) * 0x18;
          SBORROW4(local_12c,(iVar91 + 0x11) * 0x18) != local_12c + (iVar91 + 0x11) * -0x18 < 0;
          local_12c = local_12c + 0x18) {
        local_134 = iVar12;
        for (local_138 = local_f0 + 8; local_138 < local_f0 + 0x11; local_138 = local_138 + 1) {
          fVar1 = local_f8[local_134] * pfVar90[local_124] * haarResponseY[local_12c + local_138];
          fVar2 = local_f8[local_134] * pfVar90[local_124] * haarResponseX[local_12c + local_138];
          fVar89 = fVar1 + fVar89;
          fVar27 = fVar2 + fVar27;
          auVar66._8_4_ = 0x7fffffff;
          auVar66._0_8_ = 0x7fffffff7fffffff;
          auVar66._12_4_ = 0x7fffffff;
          auVar15 = vpand_avx(ZEXT416((uint)fVar1),auVar66);
          fVar25 = auVar15._0_4_ + fVar25;
          auVar67._8_4_ = 0x7fffffff;
          auVar67._0_8_ = 0x7fffffff7fffffff;
          auVar67._12_4_ = 0x7fffffff;
          auVar15 = vpand_avx(ZEXT416((uint)fVar2),auVar67);
          fVar26 = auVar15._0_4_ + fVar26;
          local_134 = iVar13 + local_134;
        }
        local_124 = iVar14 + local_124;
      }
      fVar1 = gauss_s2_arr[local_4c];
      local_4c = local_4c + 1;
      fVar89 = fVar89 * fVar1;
      fVar27 = fVar27 * fVar1;
      fVar25 = fVar25 * fVar1;
      fVar26 = fVar26 * fVar1;
      in_RSI[(long)local_44 + 5] = fVar89;
      in_RSI[(long)(local_44 + 1) + 5] = fVar27;
      in_RSI[(long)(local_44 + 2) + 5] = fVar25;
      in_RSI[(long)(local_44 + 3) + 5] = fVar26;
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar89),ZEXT416((uint)fVar89),
                                ZEXT416((uint)(fVar27 * fVar27)));
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),auVar15);
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26),auVar15);
      local_48 = auVar15._0_4_ + local_48;
      local_44 = local_44 + 4;
    }
  }
  fVar89 = sqrtf(local_48);
  for (local_16c = 0; local_16c < 0x40; local_16c = local_16c + 1) {
    in_RSI[(long)local_16c + 5] = (1.0 / fVar89) * in_RSI[(long)local_16c + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_pecompute_haar(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_gauss_compute_once_array
        - precompute haar wavelet responses and store them in two 24x24 arrays
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            int sample_y_sub_int_scale = (int) roundf(ipoint_y_sub_int_scale + l * scale);

            for (int k=-12, k_count=0; k<12; ++k, k_count++) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                int sample_x_sub_int_scale = (int) roundf(ipoint_x_sub_int_scale + k * scale);;

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }

    } else {

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            int sample_y_sub_int_scale = (int) roundf(ipoint_y_sub_int_scale + l * scale);

            for (int k=-12, k_count=0; k<12; ++k, ++k_count) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                int sample_x_sub_int_scale = (int) roundf(ipoint_x_sub_int_scale + k * scale);;

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }
        
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    /*
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                // int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                // int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8 ) {
                    gauss_s1_y = gauss_s1_c1[8-(gauss_index_l+4)];
                } else if (j == -3) {
                    gauss_s1_y = gauss_s1_c0[8-(gauss_index_l+4)];
                } else if (j == 2) {
                    gauss_s1_y = gauss_s1_c0[gauss_index_l+4];
                } else if (j == 7) {
                    gauss_s1_y = gauss_s1_c1[gauss_index_l+4];
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    // int sample_x = (int) roundf(ipoint_x + k * scale);

                    //Get x coords of sample point
                    // int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8 ) {
                        gauss_s1_x = gauss_s1_c1[8-(gauss_index_k+4)];
                    } else if (i == -3) {
                        gauss_s1_x = gauss_s1_c0[8-(gauss_index_k+4)];
                    } else if (i == 2) {
                        gauss_s1_x = gauss_s1_c0[gauss_index_k+4];
                    } else if (i == 7) {
                        gauss_s1_x = gauss_s1_c1[gauss_index_k+4];
                    }

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[(l+12)*24+(k+12)];
                    float ry = haarResponseY[(l+12)*24+(k+12)];
                    // haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    */
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}